

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *eps2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  int iVar2;
  fpclass_type fVar3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  bool bVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  int local_3a0;
  bool local_399;
  int *local_398;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_390;
  int *local_388;
  int32_t local_37c;
  int *local_378;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_370;
  int *local_368;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_328;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_68.m_backend.exp = (eps->m_backend).exp;
  local_68.m_backend.neg = (eps->m_backend).neg;
  local_68.m_backend.fpclass = (eps->m_backend).fpclass;
  local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
  local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
  local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
  local_a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
  local_a8.m_backend.exp = (eps2->m_backend).exp;
  local_a8.m_backend.neg = (eps2->m_backend).neg;
  local_a8.m_backend.fpclass = (eps2->m_backend).fpclass;
  local_a8.m_backend.prec_elem = (eps2->m_backend).prec_elem;
  local_398 = ridx;
  local_390 = eps;
  local_370 = vec;
  local_368 = idx;
  vSolveLright2(this,rhs,ridx,rn,&local_68,rhs2,ridx2,rn2,&local_a8);
  piVar7 = local_398;
  local_388 = (this->row).perm;
  local_3a0 = 0;
  local_360 = this;
  if (forest == (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x0) {
    for (lVar8 = 0; lVar8 < *rn; lVar8 = lVar8 + 1) {
      iVar6 = piVar7[lVar8];
      local_228.m_backend.exp = rhs[iVar6].m_backend.exp;
      local_228.m_backend.neg = rhs[iVar6].m_backend.neg;
      local_228.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(rhs[iVar6].m_backend.data._M_elems + 8);
      local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar6].m_backend.data._M_elems;
      local_228.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs[iVar6].m_backend.data._M_elems + 2);
      puVar1 = rhs[iVar6].m_backend.data._M_elems + 4;
      local_228.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_228.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_228.m_backend.fpclass = rhs[iVar6].m_backend.fpclass;
      local_228.m_backend.prec_elem = rhs[iVar6].m_backend.prec_elem;
      local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_390->m_backend).data._M_elems;
      local_268.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_390->m_backend).data._M_elems + 2);
      local_268.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_390->m_backend).data._M_elems + 4);
      local_268.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_390->m_backend).data._M_elems + 6);
      local_268.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_390->m_backend).data._M_elems + 8);
      local_268.m_backend.exp = (local_390->m_backend).exp;
      local_268.m_backend.neg = (local_390->m_backend).neg;
      local_268.m_backend.fpclass = (local_390->m_backend).fpclass;
      local_268.m_backend.prec_elem = (local_390->m_backend).prec_elem;
      bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_228,&local_268);
      if (bVar5) {
        enQueueMax(piVar7,&local_3a0,local_388[iVar6]);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&rhs[iVar6].m_backend,0);
      }
    }
    *rn = local_3a0;
  }
  else {
    local_378 = forestIdx;
    for (lVar8 = 0; lVar8 < *rn; lVar8 = lVar8 + 1) {
      iVar6 = piVar7[lVar8];
      local_338 = *(undefined8 *)(rhs[iVar6].m_backend.data._M_elems + 8);
      local_358 = *(undefined8 *)rhs[iVar6].m_backend.data._M_elems;
      uStack_350 = *(undefined8 *)(rhs[iVar6].m_backend.data._M_elems + 2);
      puVar1 = rhs[iVar6].m_backend.data._M_elems + 4;
      local_348 = *(undefined8 *)puVar1;
      uStack_340 = *(undefined8 *)(puVar1 + 2);
      iVar2 = rhs[iVar6].m_backend.exp;
      local_399 = rhs[iVar6].m_backend.neg;
      fVar3 = rhs[iVar6].m_backend.fpclass;
      local_37c = rhs[iVar6].m_backend.prec_elem;
      local_328.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(rhs[iVar6].m_backend.data._M_elems + 8);
      local_328.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar6].m_backend.data._M_elems;
      local_328.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs[iVar6].m_backend.data._M_elems + 2);
      puVar1 = rhs[iVar6].m_backend.data._M_elems + 4;
      local_328.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_328.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_390->m_backend).data._M_elems;
      local_1e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_390->m_backend).data._M_elems + 2);
      local_1e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_390->m_backend).data._M_elems + 4);
      local_1e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_390->m_backend).data._M_elems + 6);
      local_1e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_390->m_backend).data._M_elems + 8);
      local_1e8.m_backend.exp = (local_390->m_backend).exp;
      local_1e8.m_backend.neg = (local_390->m_backend).neg;
      local_1e8.m_backend.fpclass = (local_390->m_backend).fpclass;
      local_1e8.m_backend.prec_elem = (local_390->m_backend).prec_elem;
      local_328.m_backend.exp = iVar2;
      local_328.m_backend.neg = local_399;
      local_328.m_backend.fpclass = fVar3;
      local_328.m_backend.prec_elem = local_37c;
      bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_328,&local_1e8);
      piVar7 = local_398;
      if (bVar5) {
        *local_378 = iVar6;
        local_378 = local_378 + 1;
        enQueueMax(local_398,&local_3a0,local_388[iVar6]);
        *(undefined8 *)(forest[iVar6].m_backend.data._M_elems + 8) = local_338;
        puVar1 = forest[iVar6].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = local_348;
        *(undefined8 *)(puVar1 + 2) = uStack_340;
        *(undefined8 *)forest[iVar6].m_backend.data._M_elems = local_358;
        *(undefined8 *)(forest[iVar6].m_backend.data._M_elems + 2) = uStack_350;
        forest[iVar6].m_backend.exp = iVar2;
        forest[iVar6].m_backend.neg = local_399;
        forest[iVar6].m_backend.fpclass = fVar3;
        forest[iVar6].m_backend.prec_elem = local_37c;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&rhs[iVar6].m_backend,0);
        piVar7 = local_398;
      }
    }
    *rn = local_3a0;
    *forestNum = local_3a0;
  }
  local_3a0 = 0;
  for (lVar8 = 0; this_00 = local_360, piVar7 = local_368, vec_00 = local_370, pnVar4 = local_390,
      lVar8 < *rn2; lVar8 = lVar8 + 1) {
    iVar6 = ridx2[lVar8];
    local_2a8.m_backend.exp = rhs2[iVar6].m_backend.exp;
    local_2a8.m_backend.neg = rhs2[iVar6].m_backend.neg;
    local_2a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(rhs2[iVar6].m_backend.data._M_elems + 8);
    local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs2[iVar6].m_backend.data._M_elems;
    local_2a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(rhs2[iVar6].m_backend.data._M_elems + 2);
    puVar1 = rhs2[iVar6].m_backend.data._M_elems + 4;
    local_2a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_2a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_2a8.m_backend.fpclass = rhs2[iVar6].m_backend.fpclass;
    local_2a8.m_backend.prec_elem = rhs2[iVar6].m_backend.prec_elem;
    local_2e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
    local_2e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
    local_2e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
    local_2e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
    local_2e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
    local_2e8.m_backend.exp = (eps2->m_backend).exp;
    local_2e8.m_backend.neg = (eps2->m_backend).neg;
    local_2e8.m_backend.fpclass = (eps2->m_backend).fpclass;
    local_2e8.m_backend.prec_elem = (eps2->m_backend).prec_elem;
    bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_2a8,&local_2e8);
    if (bVar5) {
      enQueueMax(ridx2,&local_3a0,local_388[iVar6]);
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&rhs2[iVar6].m_backend,0);
    }
  }
  *rn2 = local_3a0;
  local_e8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((local_390->m_backend).data._M_elems + 8);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_390->m_backend).data._M_elems;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((local_390->m_backend).data._M_elems + 2)
  ;
  local_e8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((local_390->m_backend).data._M_elems + 4);
  local_e8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((local_390->m_backend).data._M_elems + 6);
  local_e8.m_backend.exp = (local_390->m_backend).exp;
  local_e8.m_backend.neg = (local_390->m_backend).neg;
  local_e8.m_backend.fpclass = (local_390->m_backend).fpclass;
  local_e8.m_backend.prec_elem = (local_390->m_backend).prec_elem;
  iVar6 = vSolveUright(local_360,local_370,local_368,rhs,local_398,*rn,&local_e8);
  *rn = iVar6;
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
  local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
  local_128.m_backend.exp = (eps2->m_backend).exp;
  local_128.m_backend.neg = (eps2->m_backend).neg;
  local_128.m_backend.fpclass = (eps2->m_backend).fpclass;
  local_128.m_backend.prec_elem = (eps2->m_backend).prec_elem;
  iVar6 = vSolveUright(this_00,vec2,idx2,rhs2,ridx2,*rn2,&local_128);
  *rn2 = iVar6;
  if ((this_00->l).updateType == 0) {
    local_168.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pnVar4->m_backend).data._M_elems + 8);
    local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar4->m_backend).data._M_elems;
    local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 2)
    ;
    local_168.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((pnVar4->m_backend).data._M_elems + 4);
    local_168.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((pnVar4->m_backend).data._M_elems + 6);
    local_168.m_backend.exp = (pnVar4->m_backend).exp;
    local_168.m_backend.neg = (pnVar4->m_backend).neg;
    local_168.m_backend.fpclass = (pnVar4->m_backend).fpclass;
    local_168.m_backend.prec_elem = (pnVar4->m_backend).prec_elem;
    iVar6 = vSolveUpdateRight(this_00,vec_00,piVar7,*rn,&local_168);
    *rn = iVar6;
    local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
    local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
    local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
    local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
    local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
    local_1a8.m_backend.exp = (eps2->m_backend).exp;
    local_1a8.m_backend.neg = (eps2->m_backend).neg;
    local_1a8.m_backend.fpclass = (eps2->m_backend).fpclass;
    local_1a8.m_backend.prec_elem = (eps2->m_backend).prec_elem;
    iVar6 = vSolveUpdateRight(this_00,vec2,idx2,*rn2,&local_1a8);
    *rn2 = iVar6;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update2sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R* forest, int* forestNum, int* forestIdx)
{
   /* solve with L */
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap for both ridx and ridx2 */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   /* solve with U */
   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
   }
}